

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O1

void __thiscall
ON_Hash32Table::Internal_AdjustTableCapacity(ON_Hash32Table *this,ON__UINT32 item_count)

{
  ON_Hash32TableItem *pOVar1;
  ulong uVar2;
  ON_Hash32TableItem *pOVar3;
  uint uVar4;
  ON_Hash32TableItem **__s;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = this->m_hash_table_capacity;
  if ((uVar4 < 0x40000) && (uVar6 = item_count >> 3, uVar4 <= uVar6)) {
    uVar5 = 0x40;
    if (0x40 < uVar4) {
      uVar5 = uVar4;
    }
    uVar4 = 0x40000;
    if (uVar6 < 0x40000) {
      uVar4 = uVar6;
    }
    do {
      uVar6 = uVar5;
      uVar5 = uVar6 * 2;
    } while (uVar6 < uVar4);
    __s = (ON_Hash32TableItem **)onmalloc((ulong)uVar6 << 3);
    memset(__s,0,(ulong)uVar6 << 3);
    if (this->m_item_count != 0) {
      uVar4 = this->m_hash_table_capacity;
      if ((ulong)uVar4 != 0) {
        uVar7 = 0;
        do {
          pOVar3 = this->m_hash_table[uVar7];
          while (pOVar3 != (ON_Hash32TableItem *)0x0) {
            pOVar1 = pOVar3->m_internal_next;
            uVar2 = (ulong)pOVar3->m_internal_hash32 % (ulong)uVar6;
            pOVar3->m_internal_next = __s[uVar2];
            __s[uVar2] = pOVar3;
            pOVar3 = pOVar1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar4);
      }
      onfree(this->m_hash_table);
    }
    this->m_hash_table = __s;
    this->m_hash_table_capacity = uVar6;
  }
  return;
}

Assistant:

void ON_Hash32Table::Internal_AdjustTableCapacity(
  ON__UINT32 item_count
  )
{
  const ON__UINT32 max_capacity = 256 * 1024;
  const ON__UINT32 target_list_length = 8;
  if (m_hash_table_capacity < max_capacity && item_count/target_list_length >= m_hash_table_capacity)
  {
    ON__UINT32 hash_table_capacity = m_hash_table_capacity;
    if (hash_table_capacity < 64)
      hash_table_capacity = 64;
    while (hash_table_capacity < max_capacity && item_count/target_list_length > hash_table_capacity)
      hash_table_capacity *= 2;

    size_t sizeof_hash_table = hash_table_capacity*sizeof(m_hash_table[0]);
    ON_Hash32TableItem** hash_table = (ON_Hash32TableItem**)onmalloc(sizeof_hash_table);
    memset(hash_table,0,sizeof_hash_table);
    if (m_item_count > 0)
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* item = m_hash_table[i];
        while (nullptr != item)
        {
          ON_Hash32TableItem* next = item->m_internal_next;
          const ON__UINT32 j = item->m_internal_hash32 % hash_table_capacity;
          item->m_internal_next = hash_table[j];
          hash_table[j] = item;
          item = next;
        }
      }
      onfree(m_hash_table);
    }
    m_hash_table = hash_table;
    m_hash_table_capacity = hash_table_capacity;
  }
}